

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void lua_setfield(lua_State *L,int idx,char *k)

{
  TValue *t;
  size_t l;
  TValue *i_o;
  TValue key;
  Value local_28;
  undefined4 local_20;
  
  t = index2adr(L,idx);
  l = strlen(k);
  local_28.gc = (GCObject *)luaS_newlstr(L,k,l);
  local_20 = 4;
  luaV_settable(L,t,(TValue *)&local_28,L->top + -1);
  L->top = L->top + -1;
  return;
}

Assistant:

static void lua_setfield(lua_State*L,int idx,const char*k){
StkId t;
TValue key;
api_checknelems(L,1);
t=index2adr(L,idx);
api_checkvalidindex(L,t);
setsvalue(L,&key,luaS_new(L,k));
luaV_settable(L,t,&key,L->top-1);
L->top--;
}